

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::Action<test_result_(wchar_t)>::Perform
          (Action<test_result_(wchar_t)> *this,ArgumentTuple *args)

{
  bool bVar1;
  undefined1 uVar2;
  ActionInterface<test_result_(wchar_t)> *pAVar3;
  undefined8 in_RSI;
  linked_ptr<testing::ActionInterface<test_result_(wchar_t)>_> *in_RDI;
  string *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa8;
  allocator *paVar4;
  allocator local_31;
  string local_30 [32];
  undefined8 local_10;
  
  local_10 = in_RSI;
  bVar1 = IsDoDefault((Action<test_result_(wchar_t)> *)0x16cc7d);
  uVar2 = !bVar1;
  paVar4 = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "You are using DoDefault() inside a composite action like DoAll() or WithArgs().  This is not supported for technical reasons.  Please instead spell out the default action, or assign the default action to an Action variable and use the variable in various places."
             ,paVar4);
  internal::Assert(SUB81((ulong)paVar4 >> 0x38,0),(char *)CONCAT17(uVar2,in_stack_ffffffffffffffa8),
                   (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pAVar3 = internal::linked_ptr<testing::ActionInterface<test_result_(wchar_t)>_>::operator->
                     (in_RDI);
  (*pAVar3->_vptr_ActionInterface[2])(pAVar3,local_10);
  return;
}

Assistant:

Result Perform(const ArgumentTuple& args) const {
    internal::Assert(
        !IsDoDefault(), __FILE__, __LINE__,
        "You are using DoDefault() inside a composite action like "
        "DoAll() or WithArgs().  This is not supported for technical "
        "reasons.  Please instead spell out the default action, or "
        "assign the default action to an Action variable and use "
        "the variable in various places.");
    return impl_->Perform(args);
  }